

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

int __thiscall SimpleCV::Core::Image::getPixel(Image *this,int x,int y)

{
  out_of_range *this_00;
  const_reference pvVar1;
  int y_local;
  int x_local;
  Image *this_local;
  
  if ((((-1 < x) && (x < this->width)) && (-1 < y)) && (y < this->height)) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::at(&this->pixels,(long)(y * this->width + x));
    return *pvVar1;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"Out of bounds access");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

int Image::getPixel(const int x, const int y) const
{
	if (x < 0 || x >= width || y < 0 || y >= height)
		throw std::out_of_range("Out of bounds access");

	return pixels.at(y*width + x);
}